

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void Con_SaveConfig(IResult *pResult,void *pUserData)

{
  int iVar1;
  undefined4 extraout_var;
  long *in_RSI;
  IResult *in_RDI;
  long in_FS_OFFSET;
  char aDate [20];
  char aFilename [128];
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  char *buffer;
  undefined1 local_a8 [32];
  char local_88 [112];
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = IConsole::IResult::NumArguments(in_RDI);
  if (iVar1 == 0) {
    str_timestamp(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
    str_format(local_88,0x80,"configs/config_%s.cfg",local_a8);
  }
  else {
    buffer = local_88;
    iVar1 = (*in_RDI->_vptr_IResult[4])(in_RDI,0);
    str_format(buffer,0x80,"configs/%s.cfg",CONCAT44(extraout_var,iVar1));
  }
  (**(code **)(*in_RSI + 0x28))(in_RSI,local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Con_SaveConfig(IConsole::IResult *pResult, void *pUserData)
{
	char aFilename[128];
	if(pResult->NumArguments())
		str_format(aFilename, sizeof(aFilename), "configs/%s.cfg", pResult->GetString(0));
	else
	{
		char aDate[20];
		str_timestamp(aDate, sizeof(aDate));
		str_format(aFilename, sizeof(aFilename), "configs/config_%s.cfg", aDate);
	}
	((CConfigManager *)pUserData)->Save(aFilename);
}